

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O3

bool __thiscall cali::StringConverter::to_bool(StringConverter *this,bool *okptr)

{
  size_type sVar1;
  pointer pcVar2;
  char *__nptr;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  undefined8 uVar6;
  size_type sVar7;
  bool bVar8;
  bool bVar9;
  string lower;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  bool *local_38;
  
  local_50 = 0;
  local_48 = '\0';
  sVar1 = (this->m_str)._M_string_length;
  local_58 = &local_48;
  local_38 = okptr;
  if (sVar1 != 0) {
    pcVar2 = (this->m_str)._M_dataplus._M_p;
    sVar7 = 0;
    do {
      tolower((int)pcVar2[sVar7]);
      std::__cxx11::string::push_back((char)&local_58);
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar3 == 0) {
    bVar9 = true;
LAB_0018f516:
    bVar8 = true;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_58);
    bVar8 = true;
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_58);
        bVar9 = false;
        bVar8 = false;
        if (iVar3 != 0) goto LAB_0018f51e;
      }
      bVar9 = false;
      goto LAB_0018f516;
    }
    bVar9 = true;
  }
LAB_0018f51e:
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  if (bVar8 != false) goto LAB_0018f58b;
  __nptr = (this->m_str)._M_dataplus._M_p;
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  *piVar4 = 0;
  uVar5 = strtoul(__nptr,&local_58,10);
  if (local_58 == __nptr) {
    uVar6 = std::__throw_invalid_argument("stoul");
    if (*piVar4 == 0) {
      *piVar4 = iVar3;
    }
    __cxa_begin_catch(uVar6);
    __cxa_end_catch();
    bVar8 = false;
    goto LAB_0018f58b;
  }
  if (*piVar4 == 0) {
LAB_0018f57e:
    *piVar4 = iVar3;
  }
  else if (*piVar4 == 0x22) {
    uVar5 = std::__throw_out_of_range("stoul");
    goto LAB_0018f57e;
  }
  bVar9 = uVar5 != 0;
  bVar8 = true;
LAB_0018f58b:
  if (local_38 != (bool *)0x0) {
    *local_38 = bVar8;
  }
  return bVar9;
}

Assistant:

bool cali::StringConverter::to_bool(bool* okptr) const
{
    bool ok  = false;
    bool res = false;

    // try string

    {
        std::string lower;

        std::transform(m_str.begin(), m_str.end(), std::back_inserter(lower), ::tolower);

        if (lower == "true" || lower == "t") {
            ok  = true;
            res = true;
        } else if (lower == "false" || lower == "f") {
            ok  = true;
            res = false;
        }
    }

    // try numeral

    if (!ok) {
        try {
            unsigned long i = std::stoul(m_str);

            res = (i != 0);
            ok  = true;
        } catch (...) {
            ok = false;
        }
    }

    if (okptr)
        *okptr = ok;

    return res;
}